

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall
jpge::jpeg_encoder::load_quantized_coefficients(jpeg_encoder *this,int component_num)

{
  int iVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    iVar3 = this->m_sample_array[(byte)(&s_zag)[lVar4]];
    iVar1 = this->m_quantization_tables[0 < component_num][lVar4];
    if (iVar3 < 0) {
      iVar3 = (iVar1 >> 1) - iVar3;
      if (iVar3 < iVar1) goto LAB_00155865;
      sVar2 = -(short)(iVar3 / iVar1);
    }
    else {
      iVar3 = (iVar1 >> 1) + iVar3;
      if (iVar3 < iVar1) {
LAB_00155865:
        sVar2 = 0;
      }
      else {
        sVar2 = (short)(iVar3 / iVar1);
      }
    }
    this->m_coefficient_array[lVar4] = sVar2;
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x40) {
      return;
    }
  } while( true );
}

Assistant:

void jpeg_encoder::load_quantized_coefficients(int component_num)
	{
		int32* q = m_quantization_tables[component_num > 0];
		int16* pDst = m_coefficient_array;
		for (int i = 0; i < 64; i++)
		{
			sample_array_t j = m_sample_array[s_zag[i]];
			if (j < 0)
			{
				if ((j = -j + (*q >> 1)) < *q)
					*pDst++ = 0;
				else
					*pDst++ = static_cast<int16>(-(j / *q));
			}
			else
			{
				if ((j = j + (*q >> 1)) < *q)
					*pDst++ = 0;
				else
					*pDst++ = static_cast<int16>((j / *q));
			}
			q++;
		}
	}